

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall
duckdb_parquet::EncryptionAlgorithm::EncryptionAlgorithm
          (EncryptionAlgorithm *this,EncryptionAlgorithm *other217)

{
  *(undefined ***)this = &PTR__EncryptionAlgorithm_017b5ee0;
  AesGcmV1::AesGcmV1(&this->AES_GCM_V1);
  AesGcmCtrV1::AesGcmCtrV1(&this->AES_GCM_CTR_V1);
  this->__isset = (_EncryptionAlgorithm__isset)((byte)this->__isset & 0xfc);
  AesGcmV1::operator=(&this->AES_GCM_V1,&other217->AES_GCM_V1);
  AesGcmCtrV1::operator=(&this->AES_GCM_CTR_V1,&other217->AES_GCM_CTR_V1);
  this->__isset = other217->__isset;
  return;
}

Assistant:

EncryptionAlgorithm::EncryptionAlgorithm(const EncryptionAlgorithm& other217) {
  AES_GCM_V1 = other217.AES_GCM_V1;
  AES_GCM_CTR_V1 = other217.AES_GCM_CTR_V1;
  __isset = other217.__isset;
}